

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_SubDMeshFragment::VertexNormal
          (ON_3dVector *__return_storage_ptr__,ON_SubDMeshFragment *this,uint grid_point_index)

{
  uint uVar1;
  uint grid_point_index_local;
  ON_SubDMeshFragment *this_local;
  
  uVar1 = NormalCount(this);
  if (grid_point_index < uVar1) {
    ON_3dVector::ON_3dVector
              (__return_storage_ptr__,this->m_N + (ulong)grid_point_index * this->m_N_stride);
  }
  else {
    __return_storage_ptr__->x = ON_3dVector::ZeroVector.x;
    __return_storage_ptr__->y = ON_3dVector::ZeroVector.y;
    __return_storage_ptr__->z = ON_3dVector::ZeroVector.z;
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDMeshFragment::VertexNormal(
  unsigned grid_point_index
) const
{
  return
    (grid_point_index >= NormalCount())
    ? ON_3dVector::ZeroVector
    : ON_3dVector(m_N + grid_point_index * m_N_stride)
    ;
}